

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O2

bool __thiscall
Js::BufferWriter::WriteArray<Js::ImplicitCallFlags>
          (BufferWriter *this,ImplicitCallFlags *data,size_t len)

{
  ulong uVar1;
  
  uVar1 = this->lengthLeft;
  if (len <= uVar1) {
    memcpy_s(this->current,len,data,len);
    this->current = this->current + len;
    this->lengthLeft = this->lengthLeft - len;
  }
  return len <= uVar1;
}

Assistant:

bool WriteArray(__in_ecount(len) T * data, size_t len)
        {
            size_t size = sizeof(T) * len;
            if (lengthLeft < size)
            {
                return false;
            }
            memcpy_s(current, size, data, size);
            current += size;
            lengthLeft -= size;
            return true;
        }